

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_stbvorbis_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                           void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                           ma_allocation_callbacks *pAllocationCallbacks,ma_stbvorbis *pVorbis)

{
  ma_result mVar1;
  ma_decoding_backend_config *in_RCX;
  ma_stbvorbis *in_RDX;
  long in_RSI;
  ma_allocation_callbacks *in_RDI;
  ma_stbvorbis *in_R8;
  long in_stack_00000008;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mVar1 = ma_stbvorbis_init_internal(in_RCX,in_R8);
  if (mVar1 == MA_SUCCESS) {
    if ((in_RDI == (ma_allocation_callbacks *)0x0) || (in_RSI == 0)) {
      mVar1 = MA_INVALID_ARGS;
    }
    else {
      *(ma_allocation_callbacks **)(in_stack_00000008 + 0x48) = in_RDI;
      *(long *)(in_stack_00000008 + 0x50) = in_RSI;
      *(ma_stbvorbis **)(in_stack_00000008 + 0x58) = in_RDX;
      *(ma_decoding_backend_config **)(in_stack_00000008 + 0x60) = in_RCX;
      ma_allocation_callbacks_init_copy
                ((ma_allocation_callbacks *)
                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
      mVar1 = ma_stbvorbis_init_internal_decoder_push
                        ((ma_stbvorbis *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (mVar1 == MA_SUCCESS) {
        *(undefined4 *)(in_stack_00000008 + 0xa8) = 1;
        mVar1 = ma_stbvorbis_post_init(in_RDX);
        if (mVar1 == MA_SUCCESS) {
          mVar1 = MA_SUCCESS;
        }
        else {
          stb_vorbis_close((stb_vorbis *)0x242c2a);
          ma_free((void *)CONCAT44(mVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        }
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_stbvorbis_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_stbvorbis* pVorbis)
{
    ma_result result;

    result = ma_stbvorbis_init_internal(pConfig, pVorbis);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pVorbis->onRead = onRead;
    pVorbis->onSeek = onSeek;
    pVorbis->onTell = onTell;
    pVorbis->pReadSeekTellUserData = pReadSeekTellUserData;
    ma_allocation_callbacks_init_copy(&pVorbis->allocationCallbacks, pAllocationCallbacks);

    #if !defined(MA_NO_VORBIS)
    {
        /*
        stb_vorbis lacks a callback based API for its pulling API which means we're stuck with the
        pushing API. In order for us to be able to successfully initialize the decoder we need to
        supply it with enough data. We need to keep loading data until we have enough.
        */
        result = ma_stbvorbis_init_internal_decoder_push(pVorbis);
        if (result != MA_SUCCESS) {
            return result;
        }

        pVorbis->usingPushMode = MA_TRUE;

        result = ma_stbvorbis_post_init(pVorbis);
        if (result != MA_SUCCESS) {
            stb_vorbis_close(pVorbis->stb);
            ma_free(pVorbis->push.pData, pAllocationCallbacks);
            return result;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* vorbis is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}